

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

Terminator * __thiscall soul::Optimisations::Inliner::cloneTerminator(Inliner *this,Terminator *s)

{
  bool bVar1;
  int iVar2;
  Branch *__fn;
  undefined4 extraout_var;
  BranchIf *__fn_00;
  undefined4 extraout_var_00;
  ReturnVoid *__fn_01;
  undefined4 extraout_var_01;
  ReturnValue *__fn_02;
  undefined4 extraout_var_02;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *in_R8;
  pool_ptr<const_soul::heart::ReturnValue> local_50;
  pool_ptr<const_soul::heart::ReturnValue> t_3;
  pool_ptr<const_soul::heart::ReturnVoid> t_2;
  pool_ptr<const_soul::heart::BranchIf> t_1;
  pool_ptr<const_soul::heart::Branch> local_28;
  pool_ptr<const_soul::heart::Branch> t;
  Terminator *s_local;
  Inliner *this_local;
  
  t.object = (Branch *)s;
  cast<soul::heart::Branch_const,soul::heart::Terminator>((soul *)&local_28,s);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    __fn = pool_ptr<const_soul::heart::Branch>::operator*(&local_28);
    iVar2 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    this_local = (Inliner *)CONCAT44(extraout_var,iVar2);
  }
  pool_ptr<const_soul::heart::Branch>::~pool_ptr(&local_28);
  if (!bVar1) {
    cast<soul::heart::BranchIf_const,soul::heart::Terminator>
              ((soul *)&t_2,&(t.object)->super_Terminator);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_2);
    if (bVar1) {
      __fn_00 = pool_ptr<const_soul::heart::BranchIf>::operator*
                          ((pool_ptr<const_soul::heart::BranchIf> *)&t_2);
      iVar2 = clone(this,(__fn *)__fn_00,__child_stack_00,in_ECX,in_R8);
      this_local = (Inliner *)CONCAT44(extraout_var_00,iVar2);
    }
    pool_ptr<const_soul::heart::BranchIf>::~pool_ptr((pool_ptr<const_soul::heart::BranchIf> *)&t_2);
    if (!bVar1) {
      cast<soul::heart::ReturnVoid_const,soul::heart::Terminator>
                ((soul *)&t_3,&(t.object)->super_Terminator);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_3);
      if (bVar1) {
        __fn_01 = pool_ptr<const_soul::heart::ReturnVoid>::operator*
                            ((pool_ptr<const_soul::heart::ReturnVoid> *)&t_3);
        iVar2 = clone(this,(__fn *)__fn_01,__child_stack_01,in_ECX,in_R8);
        this_local = (Inliner *)CONCAT44(extraout_var_01,iVar2);
      }
      pool_ptr<const_soul::heart::ReturnVoid>::~pool_ptr
                ((pool_ptr<const_soul::heart::ReturnVoid> *)&t_3);
      if (!bVar1) {
        cast<soul::heart::ReturnValue_const,soul::heart::Terminator>
                  ((soul *)&local_50,&(t.object)->super_Terminator);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
        if (bVar1) {
          __fn_02 = pool_ptr<const_soul::heart::ReturnValue>::operator*(&local_50);
          iVar2 = clone(this,(__fn *)__fn_02,__child_stack_02,in_ECX,in_R8);
          this_local = (Inliner *)CONCAT44(extraout_var_02,iVar2);
        }
        pool_ptr<const_soul::heart::ReturnValue>::~pool_ptr(&local_50);
        if (!bVar1) {
          throwInternalCompilerError("cloneTerminator",0x26a);
        }
      }
    }
  }
  return (Terminator *)this_local;
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
        {
            #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
            SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
            #undef SOUL_CLONE_TERMINATOR
            SOUL_ASSERT_FALSE;
            return s;
        }